

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3fShaderStateQueryTests.cpp
# Opt level: O0

void __thiscall
deqp::gles3::Functional::anon_unknown_0::TransformFeedbackCase::test(TransformFeedbackCase *this)

{
  GLuint shader;
  GLuint shader_00;
  GLuint program;
  GLuint local_3c;
  char *pcStack_38;
  GLuint transformFeedbackId;
  char *transformFeedbackOutputs [2];
  GLuint shaderProg;
  GLuint shaderFrag;
  GLuint shaderVert;
  TransformFeedbackCase *this_local;
  
  shader = glu::CallLogWrapper::glCreateShader(&(this->super_ApiCase).super_CallLogWrapper,0x8b31);
  shader_00 = glu::CallLogWrapper::glCreateShader
                        (&(this->super_ApiCase).super_CallLogWrapper,0x8b30);
  glu::CallLogWrapper::glShaderSource
            (&(this->super_ApiCase).super_CallLogWrapper,shader,1,
             &test::transformFeedbackTestVertSource,(GLint *)0x0);
  glu::CallLogWrapper::glShaderSource
            (&(this->super_ApiCase).super_CallLogWrapper,shader_00,1,
             &test::transformFeedbackTestFragSource,(GLint *)0x0);
  glu::CallLogWrapper::glCompileShader(&(this->super_ApiCase).super_CallLogWrapper,shader);
  glu::CallLogWrapper::glCompileShader(&(this->super_ApiCase).super_CallLogWrapper,shader_00);
  ApiCase::expectError(&this->super_ApiCase,0);
  program = glu::CallLogWrapper::glCreateProgram(&(this->super_ApiCase).super_CallLogWrapper);
  glu::CallLogWrapper::glAttachShader(&(this->super_ApiCase).super_CallLogWrapper,program,shader);
  glu::CallLogWrapper::glAttachShader(&(this->super_ApiCase).super_CallLogWrapper,program,shader_00)
  ;
  pcStack_38 = "gl_Position";
  transformFeedbackOutputs[0] = "anotherOutput";
  glu::CallLogWrapper::glTransformFeedbackVaryings
            (&(this->super_ApiCase).super_CallLogWrapper,program,2,&stack0xffffffffffffffc8,0x8c8c);
  glu::CallLogWrapper::glLinkProgram(&(this->super_ApiCase).super_CallLogWrapper,program);
  ApiCase::expectError(&this->super_ApiCase,0);
  local_3c = 0;
  glu::CallLogWrapper::glGenTransformFeedbacks
            (&(this->super_ApiCase).super_CallLogWrapper,1,&local_3c);
  glu::CallLogWrapper::glBindTransformFeedback
            (&(this->super_ApiCase).super_CallLogWrapper,0x8e22,local_3c);
  ApiCase::expectError(&this->super_ApiCase,0);
  (*(this->super_ApiCase).super_TestCase.super_TestCase.super_TestNode._vptr_TestNode[6])();
  glu::CallLogWrapper::glBindTransformFeedback(&(this->super_ApiCase).super_CallLogWrapper,0x8e22,0)
  ;
  glu::CallLogWrapper::glDeleteTransformFeedbacks
            (&(this->super_ApiCase).super_CallLogWrapper,1,&local_3c);
  glu::CallLogWrapper::glDeleteShader(&(this->super_ApiCase).super_CallLogWrapper,shader);
  glu::CallLogWrapper::glDeleteShader(&(this->super_ApiCase).super_CallLogWrapper,shader_00);
  glu::CallLogWrapper::glDeleteProgram(&(this->super_ApiCase).super_CallLogWrapper,program);
  ApiCase::expectError(&this->super_ApiCase,0);
  return;
}

Assistant:

void test (void)
	{
		using tcu::TestLog;

		static const char* transformFeedbackTestVertSource =
			"#version 300 es\n"
			"out highp vec4 tfOutput2withLongName;\n"
			"void main (void)\n"
			"{\n"
			"	gl_Position = vec4(0.0);\n"
			"	tfOutput2withLongName = vec4(0.0);\n"
			"}\n";
		static const char* transformFeedbackTestFragSource =
			"#version 300 es\n"
			"layout(location = 0) out highp vec4 fragColor;\n"
			"void main (void)\n"
			"{\n"
			"	fragColor = vec4(0.0);\n"
			"}\n";

		GLuint shaderVert = glCreateShader(GL_VERTEX_SHADER);
		GLuint shaderFrag = glCreateShader(GL_FRAGMENT_SHADER);
		GLuint shaderProg = glCreateProgram();

		verifyProgramParam(m_testCtx, *this, shaderProg, GL_TRANSFORM_FEEDBACK_BUFFER_MODE, GL_INTERLEAVED_ATTRIBS);

		glShaderSource(shaderVert, 1, &transformFeedbackTestVertSource, DE_NULL);
		glShaderSource(shaderFrag, 1, &transformFeedbackTestFragSource, DE_NULL);

		glCompileShader(shaderVert);
		glCompileShader(shaderFrag);

		verifyShaderParam(m_testCtx, *this, shaderVert, GL_COMPILE_STATUS, GL_TRUE);
		verifyShaderParam(m_testCtx, *this, shaderFrag, GL_COMPILE_STATUS, GL_TRUE);

		glAttachShader(shaderProg, shaderVert);
		glAttachShader(shaderProg, shaderFrag);

		// check TRANSFORM_FEEDBACK_BUFFER_MODE

		const char* transform_feedback_outputs[] = {"gl_Position", "tfOutput2withLongName"};
		const char* longest_output = transform_feedback_outputs[1];
		const GLenum bufferModes[] = {GL_SEPARATE_ATTRIBS, GL_INTERLEAVED_ATTRIBS};

		for (int ndx = 0; ndx < DE_LENGTH_OF_ARRAY(bufferModes); ++ndx)
		{
			glTransformFeedbackVaryings(shaderProg, DE_LENGTH_OF_ARRAY(transform_feedback_outputs), transform_feedback_outputs, bufferModes[ndx]);
			glLinkProgram(shaderProg);
			expectError(GL_NO_ERROR);

			verifyProgramParam(m_testCtx, *this, shaderProg, GL_LINK_STATUS, GL_TRUE);
			verifyProgramParam(m_testCtx, *this, shaderProg, GL_TRANSFORM_FEEDBACK_BUFFER_MODE, bufferModes[ndx]);
		}

		// TRANSFORM_FEEDBACK_VARYINGS
		verifyProgramParam(m_testCtx, *this, shaderProg, GL_TRANSFORM_FEEDBACK_VARYINGS, 2);

		// TRANSFORM_FEEDBACK_VARYING_MAX_LENGTH
		{
			StateQueryMemoryWriteGuard<GLint> maxOutputLen;
			glGetProgramiv(shaderProg, GL_TRANSFORM_FEEDBACK_VARYING_MAX_LENGTH, &maxOutputLen);

			maxOutputLen.verifyValidity(m_testCtx);

			const GLint referenceLength = (GLint)std::string(longest_output).length() + 1;
			checkIntEquals(m_testCtx, maxOutputLen, referenceLength);
		}

		// check varyings
		{
			StateQueryMemoryWriteGuard<GLint> varyings;
			glGetProgramiv(shaderProg, GL_TRANSFORM_FEEDBACK_VARYINGS, &varyings);

			if (!varyings.isUndefined())
				for (int index = 0; index < varyings; ++index)
				{
					char buffer[2048] = {'x'};

					GLint written = 0;
					GLint size = 0;
					GLenum type = 0;
					glGetTransformFeedbackVarying(shaderProg, index, DE_LENGTH_OF_ARRAY(buffer), &written, &size, &type, buffer);

					if (written < DE_LENGTH_OF_ARRAY(buffer) && buffer[written] != '\0')
					{
						m_testCtx.getLog() << TestLog::Message << "// ERROR: Expected null terminator" << TestLog::EndMessage;
						if (m_testCtx.getTestResult() == QP_TEST_RESULT_PASS)
							m_testCtx.setTestResult(QP_TEST_RESULT_FAIL, "got invalid string terminator");
					}

					// check with too small buffer
					written = 0;
					glGetTransformFeedbackVarying(shaderProg, index, 1, &written, &size, &type, buffer);
					if (written != 0)
					{
						m_testCtx.getLog() << TestLog::Message << "// ERROR: Expected 0; got " << written << TestLog::EndMessage;
						if (m_testCtx.getTestResult() == QP_TEST_RESULT_PASS)
							m_testCtx.setTestResult(QP_TEST_RESULT_FAIL, "got invalid write length");
					}
				}
		}


		glDeleteShader(shaderVert);
		glDeleteShader(shaderFrag);
		glDeleteProgram(shaderProg);
		expectError(GL_NO_ERROR);
	}